

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int coda_ascbin_cursor_goto_next_record_field(coda_cursor *cursor)

{
  long lVar1;
  coda_expression *expr;
  int iVar2;
  int iVar3;
  coda_dynamic_type *pcVar4;
  long lVar5;
  long lVar6;
  coda_type *pcVar7;
  int available;
  long available_index;
  coda_cursor record_cursor;
  int local_354;
  long local_350;
  long local_348;
  coda_cursor local_340;
  
  local_354 = 1;
  lVar5 = (long)cursor->n;
  pcVar7 = (coda_type *)cursor->stack[lVar5 + -2].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  lVar6 = cursor->stack[lVar5 + -1].index;
  lVar1 = lVar6 + 1;
  if ((lVar6 < -1) || ((long)pcVar7[1].name <= lVar1)) {
    coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",lVar1);
  }
  else {
    lVar5 = cursor->stack[lVar5 + -2].bit_offset;
    if (pcVar7[1].attributes == (coda_type_record *)0x0) {
      iVar2 = get_next_relative_field_bit_offset(cursor,&local_348,(int64_t *)0x0);
      if (iVar2 == 0) {
        local_350 = lVar5 + local_348;
        expr = *(coda_expression **)(*(long *)(pcVar7[1].description + lVar6 * 8 + 8) + 0x20);
        if (expr == (coda_expression *)0x0) {
          iVar2 = 1;
        }
        else {
          memcpy(&local_340,cursor,0x310);
          local_340.n = local_340.n + -1;
          iVar3 = coda_expression_eval_bool(expr,&local_340,&local_354);
          iVar2 = local_354;
          if (iVar3 != 0) {
            coda_add_error_message(" for available expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
          }
        }
        goto LAB_00182f47;
      }
    }
    else {
      local_350 = lVar5;
      memcpy(&local_340,cursor,0x310);
      local_340.n = local_340.n + -1;
      iVar2 = coda_cursor_get_available_union_field_index(&local_340,&local_348);
      if (iVar2 == 0) {
        iVar2 = 1;
        if (lVar1 != local_348) {
          local_354 = 0;
          iVar2 = 0;
        }
LAB_00182f47:
        lVar5 = local_350;
        if (iVar2 == 0) {
          pcVar4 = coda_no_data_singleton(pcVar7->format);
        }
        else {
          pcVar4 = *(coda_dynamic_type **)(*(long *)(pcVar7[1].description + lVar6 * 8 + 8) + 0x10);
        }
        lVar6 = (long)cursor->n;
        cursor->stack[lVar6 + -1].type = pcVar4;
        cursor->stack[lVar6 + -1].index = lVar1;
        cursor->stack[lVar6 + -1].bit_offset = lVar5;
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int coda_ascbin_cursor_goto_next_record_field(coda_cursor *cursor)
{
    coda_type_record *record;
    int64_t bit_offset;
    int available = 1;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 2].type);
    index = cursor->stack[cursor->n - 1].index + 1;
    if (index < 0 || index >= record->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       record->num_fields);
        return -1;
    }

    bit_offset = cursor->stack[cursor->n - 2].bit_offset;
    if (record->union_field_expr != NULL)
    {
        coda_cursor record_cursor = *cursor;
        long available_index;

        record_cursor.n--;
        if (coda_cursor_get_available_union_field_index(&record_cursor, &available_index) != 0)
        {
            return -1;
        }
        if (index != available_index)
        {
            available = 0;
        }
    }
    else
    {
        int64_t rel_bit_offset;

        if (get_next_relative_field_bit_offset(cursor, &rel_bit_offset, NULL) != 0)
        {
            return -1;
        }
        bit_offset += rel_bit_offset;
        if (record->field[index]->available_expr != NULL)
        {
            coda_cursor record_cursor = *cursor;

            record_cursor.n--;
            if (coda_expression_eval_bool(record->field[index]->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
        }
    }
    if (available)
    {
        cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    }
    else
    {
        cursor->stack[cursor->n - 1].type = coda_no_data_singleton(record->format);
    }
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = bit_offset;

    return 0;
}